

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.h
# Opt level: O0

int h2o_url_hosts_are_equal(h2o_url_t *url_a,h2o_url_t *url_b)

{
  int iVar1;
  h2o_url_t *url_b_local;
  h2o_url_t *url_a_local;
  
  if ((url_a->host).len == (url_b->host).len) {
    iVar1 = h2o_url_host_is_unix_path(url_a->host);
    if (iVar1 == 0) {
      url_a_local._4_4_ =
           h2o_lcstris((url_a->host).base,(url_a->host).len,(url_b->host).base,(url_b->host).len);
    }
    else {
      url_a_local._4_4_ =
           h2o_memis((url_a->host).base,(url_a->host).len,(url_b->host).base,(url_b->host).len);
    }
  }
  else {
    url_a_local._4_4_ = 0;
  }
  return url_a_local._4_4_;
}

Assistant:

static inline int h2o_url_hosts_are_equal(const h2o_url_t *url_a, const h2o_url_t *url_b)
{
    if (url_a->host.len != url_b->host.len)
        return 0;

    if (h2o_url_host_is_unix_path(url_a->host))
        return h2o_memis(url_a->host.base, url_a->host.len, url_b->host.base, url_b->host.len);
    else
        return h2o_lcstris(url_a->host.base, url_a->host.len, url_b->host.base, url_b->host.len);
}